

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

bool __thiscall DMenu::MenuEvent(DMenu *this,int mkey,bool fromcontroller)

{
  char *logicalname;
  FSoundID local_c;
  
  if (mkey == 7) {
    (*(this->super_DObject)._vptr_DObject[0xd])();
    logicalname = "menu/backup";
    if (CurrentMenu == (DMenu *)0x0) {
      logicalname = "menu/clear";
    }
    local_c.ID = S_FindSound(logicalname);
    S_Sound(0x22,&local_c,snd_menuvolume.Value,0.0);
  }
  return mkey == 7;
}

Assistant:

bool DMenu::MenuEvent (int mkey, bool fromcontroller)
{
	switch (mkey)
	{
	case MKEY_Back:
	{
		Close();
		S_Sound (CHAN_VOICE | CHAN_UI, 
			DMenu::CurrentMenu != NULL? "menu/backup" : "menu/clear", snd_menuvolume, ATTN_NONE);
		return true;
	}
	}
	return false;
}